

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cc
# Opt level: O0

string * benchmark::ToBinaryStringFullySpecified_abi_cxx11_
                   (double value,double threshold,int precision)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  bool in_stack_00000017;
  int64_t in_stack_00000018;
  int64_t exponent;
  string mantissa;
  int64_t *in_stack_000001b8;
  string *in_stack_000001c0;
  double in_stack_000001c8;
  int in_stack_000001d4;
  double in_stack_000001d8;
  double in_stack_000001e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_78 [56];
  string local_40 [64];
  
  __lhs = in_RDI;
  std::__cxx11::string::string(local_40);
  ToExponentAndMantissa
            (in_stack_000001e0,in_stack_000001d8,in_stack_000001d4,in_stack_000001c8,
             in_stack_000001c0,in_stack_000001b8);
  ExponentToPrefix_abi_cxx11_(in_stack_00000018,in_stack_00000017);
  std::operator+(__lhs,in_RDI);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_40);
  return __lhs;
}

Assistant:

std::string ToBinaryStringFullySpecified(double value, double threshold,
                                         int precision) {
  std::string mantissa;
  int64_t exponent;
  ToExponentAndMantissa(value, threshold, precision, 1024.0, &mantissa,
                        &exponent);
  return mantissa + ExponentToPrefix(exponent, false);
}